

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O0

int __thiscall Annotations::Load(Annotations *this)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  undefined1 *puVar3;
  undefined8 uVar4;
  string *in_RDI;
  int r;
  size_type pos;
  string sqlfn;
  Annotations *in_stack_00000130;
  string local_28 [40];
  
  std::__cxx11::string::string(local_28,in_RDI);
  lVar2 = std::__cxx11::string::rfind((char)local_28,0x2e);
  if (lVar2 != -1) {
    puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_28);
    *puVar3 = 0x5f;
  }
  std::__cxx11::string::operator+=(local_28,".sqlite3");
  *(undefined8 *)(in_RDI + 0x20) = 0;
  uVar4 = std::__cxx11::string::c_str();
  iVar1 = sqlite3_open(uVar4,in_RDI + 0x20);
  __stream = _stderr;
  if (iVar1 == 0) {
    if (((byte)in_RDI[0x28] & 1) != 0) {
      fprintf(_stderr,"Opened database successfully\n");
    }
    Init((Annotations *)pos);
    GenerateList(in_stack_00000130);
  }
  else {
    uVar4 = sqlite3_errmsg(*(undefined8 *)(in_RDI + 0x20));
    fprintf(__stream,"Can\'t open database: %s\n",uVar4);
  }
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int Annotations::Load(void) {
	std::string sqlfn                        = filename;
	auto pos                                 = sqlfn.rfind('.');
	if (pos != std::string::npos) sqlfn[pos] = '_';
	sqlfn += ".sqlite3";

	sqldb = nullptr;
	int r = sqlite3_open(sqlfn.c_str(), &sqldb);
	if (r) {
		fprintf(stderr, "Can't open database: %s\n", sqlite3_errmsg(sqldb));
	} else {
		if (debug) fprintf(stderr, "Opened database successfully\n");
		Init();
		GenerateList();
	}
	return 0;
}